

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2ExternalSubset(void *ctx,xmlChar *name,xmlChar *ExternalID,xmlChar *SystemID)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  xmlCharEncoding enc_00;
  int iVar7;
  void *pvVar8;
  xmlChar *pxVar9;
  xmlChar *oldencoding;
  int oldcharset;
  xmlCharEncoding enc;
  xmlParserInputPtr input;
  xmlParserInputPtr *oldinputTab;
  int oldinputMax;
  int oldinputNr;
  xmlParserInputPtr oldinput;
  xmlParserCtxtPtr ctxt;
  xmlChar *SystemID_local;
  xmlChar *ExternalID_local;
  xmlChar *name_local;
  void *ctx_local;
  
  if ((((ctx != (void *)0x0) && ((ExternalID != (xmlChar *)0x0 || (SystemID != (xmlChar *)0x0)))) &&
      ((*(int *)((long)ctx + 0x9c) != 0 || (*(int *)((long)ctx + 0x1b0) != 0)))) &&
     ((*(int *)((long)ctx + 0x18) != 0 && (*(long *)((long)ctx + 0x10) != 0)))) {
    _oldcharset = (xmlParserInputPtr)0x0;
    if ((*ctx != 0) && (*(long *)(*ctx + 0x20) != 0)) {
      _oldcharset = (xmlParserInputPtr)
                    (**(code **)(*ctx + 0x20))(*(undefined8 *)((long)ctx + 8),ExternalID,SystemID);
    }
    if (_oldcharset != (xmlParserInputPtr)0x0) {
      xmlNewDtd(*(xmlDocPtr *)((long)ctx + 0x10),name,ExternalID,SystemID);
      uVar4 = *(undefined8 *)((long)ctx + 0x38);
      uVar1 = *(undefined4 *)((long)ctx + 0x40);
      uVar2 = *(undefined4 *)((long)ctx + 0x44);
      uVar5 = *(undefined8 *)((long)ctx + 0x48);
      uVar3 = *(undefined4 *)((long)ctx + 0x198);
      uVar6 = *(undefined8 *)((long)ctx + 0x28);
      *(undefined8 *)((long)ctx + 0x28) = 0;
      pvVar8 = (*xmlMalloc)(0x28);
      *(void **)((long)ctx + 0x48) = pvVar8;
      if (*(long *)((long)ctx + 0x48) == 0) {
        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2ExternalSubset");
        xmlFreeInputStream(_oldcharset);
        *(undefined8 *)((long)ctx + 0x38) = uVar4;
        *(undefined4 *)((long)ctx + 0x40) = uVar1;
        *(undefined4 *)((long)ctx + 0x44) = uVar2;
        *(undefined8 *)((long)ctx + 0x48) = uVar5;
        *(undefined4 *)((long)ctx + 0x198) = uVar3;
        *(undefined8 *)((long)ctx + 0x28) = uVar6;
      }
      else {
        *(undefined4 *)((long)ctx + 0x40) = 0;
        *(undefined4 *)((long)ctx + 0x44) = 5;
        *(undefined8 *)((long)ctx + 0x38) = 0;
        xmlPushInput((xmlParserCtxtPtr)ctx,_oldcharset);
        if (3 < *(int *)(*(long *)((long)ctx + 0x38) + 0x30)) {
          enc_00 = xmlDetectCharEncoding(*(uchar **)(*(long *)((long)ctx + 0x38) + 0x20),4);
          xmlSwitchEncoding((xmlParserCtxtPtr)ctx,enc_00);
        }
        if (_oldcharset->filename == (char *)0x0) {
          pxVar9 = xmlCanonicPath(SystemID);
          _oldcharset->filename = (char *)pxVar9;
        }
        _oldcharset->line = 1;
        _oldcharset->col = 1;
        _oldcharset->base = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 0x20);
        _oldcharset->cur = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 0x20);
        _oldcharset->free = (xmlParserInputDeallocate)0x0;
        xmlParseExternalSubset((xmlParserCtxtPtr)ctx,ExternalID,SystemID);
        while (1 < *(int *)((long)ctx + 0x40)) {
          xmlPopInput((xmlParserCtxtPtr)ctx);
        }
        xmlFreeInputStream(*(xmlParserInputPtr *)((long)ctx + 0x38));
        (*xmlFree)(*(void **)((long)ctx + 0x48));
        *(undefined8 *)((long)ctx + 0x38) = uVar4;
        *(undefined4 *)((long)ctx + 0x40) = uVar1;
        *(undefined4 *)((long)ctx + 0x44) = uVar2;
        *(undefined8 *)((long)ctx + 0x48) = uVar5;
        *(undefined4 *)((long)ctx + 0x198) = uVar3;
        if ((*(long *)((long)ctx + 0x28) != 0) &&
           ((*(long *)((long)ctx + 0x1c8) == 0 ||
            (iVar7 = xmlDictOwns(*(xmlDictPtr *)((long)ctx + 0x1c8),*(xmlChar **)((long)ctx + 0x28))
            , iVar7 == 0)))) {
          (*xmlFree)(*(void **)((long)ctx + 0x28));
        }
        *(undefined8 *)((long)ctx + 0x28) = uVar6;
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2ExternalSubset(void *ctx, const xmlChar *name,
	       const xmlChar *ExternalID, const xmlChar *SystemID)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    if (ctx == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2ExternalSubset(%s, %s, %s)\n",
            name, ExternalID, SystemID);
#endif
    if (((ExternalID != NULL) || (SystemID != NULL)) &&
        (((ctxt->validate) || (ctxt->loadsubset != 0)) &&
	 (ctxt->wellFormed && ctxt->myDoc))) {
	/*
	 * Try to fetch and parse the external subset.
	 */
	xmlParserInputPtr oldinput;
	int oldinputNr;
	int oldinputMax;
	xmlParserInputPtr *oldinputTab;
	xmlParserInputPtr input = NULL;
	xmlCharEncoding enc;
	int oldcharset;
	const xmlChar *oldencoding;

	/*
	 * Ask the Entity resolver to load the damn thing
	 */
	if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	    input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                        SystemID);
	if (input == NULL) {
	    return;
	}

	xmlNewDtd(ctxt->myDoc, name, ExternalID, SystemID);

	/*
	 * make sure we won't destroy the main document context
	 */
	oldinput = ctxt->input;
	oldinputNr = ctxt->inputNr;
	oldinputMax = ctxt->inputMax;
	oldinputTab = ctxt->inputTab;
	oldcharset = ctxt->charset;
	oldencoding = ctxt->encoding;
	ctxt->encoding = NULL;

	ctxt->inputTab = (xmlParserInputPtr *)
	                 xmlMalloc(5 * sizeof(xmlParserInputPtr));
	if (ctxt->inputTab == NULL) {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2ExternalSubset");
            xmlFreeInputStream(input);
	    ctxt->input = oldinput;
	    ctxt->inputNr = oldinputNr;
	    ctxt->inputMax = oldinputMax;
	    ctxt->inputTab = oldinputTab;
	    ctxt->charset = oldcharset;
	    ctxt->encoding = oldencoding;
	    return;
	}
	ctxt->inputNr = 0;
	ctxt->inputMax = 5;
	ctxt->input = NULL;
	xmlPushInput(ctxt, input);

	/*
	 * On the fly encoding conversion if needed
	 */
	if (ctxt->input->length >= 4) {
	    enc = xmlDetectCharEncoding(ctxt->input->cur, 4);
	    xmlSwitchEncoding(ctxt, enc);
	}

	if (input->filename == NULL)
	    input->filename = (char *) xmlCanonicPath(SystemID);
	input->line = 1;
	input->col = 1;
	input->base = ctxt->input->cur;
	input->cur = ctxt->input->cur;
	input->free = NULL;

	/*
	 * let's parse that entity knowing it's an external subset.
	 */
	xmlParseExternalSubset(ctxt, ExternalID, SystemID);

        /*
	 * Free up the external entities
	 */

	while (ctxt->inputNr > 1)
	    xmlPopInput(ctxt);
	xmlFreeInputStream(ctxt->input);
        xmlFree(ctxt->inputTab);

	/*
	 * Restore the parsing context of the main entity
	 */
	ctxt->input = oldinput;
	ctxt->inputNr = oldinputNr;
	ctxt->inputMax = oldinputMax;
	ctxt->inputTab = oldinputTab;
	ctxt->charset = oldcharset;
	if ((ctxt->encoding != NULL) &&
	    ((ctxt->dict == NULL) ||
	     (!xmlDictOwns(ctxt->dict, ctxt->encoding))))
	    xmlFree((xmlChar *) ctxt->encoding);
	ctxt->encoding = oldencoding;
	/* ctxt->wellFormed = oldwellFormed; */
    }
}